

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::param::Quality::computeMetrics(Quality *this,Mesh *mesh)

{
  float *a_00;
  float *a_01;
  bool bVar1;
  bool bVar2;
  float fVar3;
  Vector3 *pVVar4;
  Vector2 *pVVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Vector3 VVar9;
  Vector2 *local_2c0;
  Vector3 *local_2a8;
  float normFactor;
  float rmsStretch2;
  float rmsStretch;
  float local_284;
  float local_280;
  float sigma2;
  float local_278;
  float local_274;
  float sigma1;
  float c;
  float b;
  float a;
  float local_260;
  Vector3 local_258;
  Vector3 local_248;
  Vector3 local_238;
  Vector3 local_228;
  Vector3 local_218;
  Vector3 local_208;
  Vector3 local_1f8;
  Vector3 local_1e8;
  Vector3 local_1d8;
  Vector3 local_1c8;
  undefined1 local_1bc [8];
  Vector3 St;
  float local_1a8;
  Vector3 local_1a0;
  Vector3 local_190;
  Vector3 local_180;
  Vector3 local_170;
  Vector3 local_160;
  Vector3 local_150;
  Vector3 local_140;
  Vector3 local_130;
  Vector3 local_120;
  Vector3 local_110;
  undefined1 local_100 [8];
  Vector3 Ss;
  float fStack_ec;
  float local_e8;
  Vector3 local_e0;
  Vector3 local_d0;
  Vector3 local_c0;
  Vector3 local_b0;
  Vector3 local_a0;
  float local_90;
  float local_8c;
  float geometricArea;
  float parametricArea;
  float s3;
  float t3;
  float s2;
  float t2;
  float s1;
  float t1;
  uint32_t v;
  int i;
  Vector2 texcoord [3];
  undefined1 local_48 [8];
  Vector3 pos [3];
  uint32_t f;
  uint32_t faceCount;
  Mesh *mesh_local;
  Quality *this_local;
  
  this->totalParametricArea = 0.0;
  this->totalGeometricArea = 0.0;
  this->authalicMetric = 0.0;
  this->conformalMetric = 0.0;
  this->maxStretchMetric = 0.0;
  this->stretchMetric = 0.0;
  fVar3 = (float)Mesh::faceCount(mesh);
  for (pos[2].z = 0.0; (uint)pos[2].z < (uint)fVar3; pos[2].z = (float)((int)pos[2].z + 1)) {
    local_2a8 = (Vector3 *)local_48;
    do {
      Vector3::Vector3(local_2a8);
      local_2a8 = local_2a8 + 1;
    } while (local_2a8 != (Vector3 *)&pos[2].y);
    local_2c0 = (Vector2 *)&v;
    do {
      Vector2::Vector2(local_2c0);
      local_2c0 = local_2c0 + 1;
    } while (local_2c0 != texcoord + 2);
    for (t1 = 0.0; (int)t1 < 3; t1 = (float)((int)t1 + 1)) {
      s1 = (float)Mesh::vertexAt(mesh,(int)pos[2].z * 3 + (int)t1);
      pVVar4 = Mesh::position(mesh,(uint32_t)s1);
      fVar6 = pVVar4->y;
      pos[(long)(int)t1 + -1].y = pVVar4->x;
      pos[(long)(int)t1 + -1].z = fVar6;
      pos[(int)t1].x = pVVar4->z;
      pVVar5 = Mesh::texcoord(mesh,(uint32_t)s1);
      *(Vector2 *)(&v + (long)(int)t1 * 2) = *pVVar5;
    }
    t2 = (float)v;
    s2 = (float)i;
    t3 = texcoord[0].x;
    s3 = texcoord[0].y;
    parametricArea = texcoord[1].x;
    geometricArea = texcoord[1].y;
    local_8c = ((texcoord[0].y - (float)i) * (texcoord[1].x - (float)v) +
               -((texcoord[1].y - (float)i) * (texcoord[0].x - (float)v))) * 0.5;
    bVar1 = isZero(local_8c,1.1920929e-07);
    if (!bVar1) {
      if (local_8c < 0.0) {
        local_8c = ABS(local_8c);
      }
      a_00 = &pos[0].y;
      VVar9 = operator-((Vector3 *)a_00,(Vector3 *)local_48);
      local_c0.z = VVar9.z;
      local_b0.z = local_c0.z;
      local_c0._0_8_ = VVar9._0_8_;
      local_b0.x = local_c0.x;
      local_b0.y = local_c0.y;
      a_01 = &pos[1].y;
      local_c0 = VVar9;
      VVar9 = operator-((Vector3 *)a_01,(Vector3 *)local_48);
      local_e0.z = VVar9.z;
      local_d0.z = local_e0.z;
      local_e0._0_8_ = VVar9._0_8_;
      local_d0.x = local_e0.x;
      local_d0.y = local_e0.y;
      VVar9 = cross(&local_b0,&local_d0);
      local_e8 = VVar9.z;
      local_a0.z = local_e8;
      stack0xffffffffffffff10 = VVar9._0_8_;
      local_a0.x = Ss.z;
      local_a0.y = fStack_ec;
      unique0x10000f56 = VVar9;
      local_90 = length(&local_a0);
      local_90 = local_90 * 0.5;
      VVar9 = operator*((Vector3 *)local_48,t3 - parametricArea);
      local_140.z = VVar9.z;
      local_130.z = local_140.z;
      local_140._0_8_ = VVar9._0_8_;
      local_130.x = local_140.x;
      local_130.y = local_140.y;
      local_140 = VVar9;
      VVar9 = operator*((Vector3 *)a_00,parametricArea - t2);
      local_160.z = VVar9.z;
      local_150.z = local_160.z;
      local_160._0_8_ = VVar9._0_8_;
      local_150.x = local_160.x;
      local_150.y = local_160.y;
      local_160 = VVar9;
      VVar9 = operator+(&local_130,&local_150);
      local_170.z = VVar9.z;
      local_120.z = local_170.z;
      local_170._0_8_ = VVar9._0_8_;
      local_120.x = local_170.x;
      local_120.y = local_170.y;
      local_170 = VVar9;
      VVar9 = operator*((Vector3 *)a_01,t2 - t3);
      local_190.z = VVar9.z;
      local_180.z = local_190.z;
      local_190._0_8_ = VVar9._0_8_;
      local_180.x = local_190.x;
      local_180.y = local_190.y;
      VVar9 = operator+(&local_120,&local_180);
      local_1a0.z = VVar9.z;
      local_110.z = local_1a0.z;
      local_1a0._0_8_ = VVar9._0_8_;
      local_110.x = local_1a0.x;
      local_110.y = local_1a0.y;
      VVar9 = operator/(&local_110,local_8c + local_8c);
      local_1a8 = VVar9.z;
      Ss.x = local_1a8;
      St._4_8_ = VVar9._0_8_;
      local_100._0_4_ = St.y;
      local_100._4_4_ = St.z;
      unique0x10000f26 = VVar9;
      VVar9 = operator*((Vector3 *)local_48,geometricArea - s3);
      local_1f8.z = VVar9.z;
      local_1e8.z = local_1f8.z;
      local_1f8._0_8_ = VVar9._0_8_;
      local_1e8.x = local_1f8.x;
      local_1e8.y = local_1f8.y;
      local_1f8 = VVar9;
      VVar9 = operator*((Vector3 *)a_00,s2 - geometricArea);
      local_218.z = VVar9.z;
      local_208.z = local_218.z;
      local_218._0_8_ = VVar9._0_8_;
      local_208.x = local_218.x;
      local_208.y = local_218.y;
      local_218 = VVar9;
      VVar9 = operator+(&local_1e8,&local_208);
      local_228.z = VVar9.z;
      local_1d8.z = local_228.z;
      local_228._0_8_ = VVar9._0_8_;
      local_1d8.x = local_228.x;
      local_1d8.y = local_228.y;
      local_228 = VVar9;
      VVar9 = operator*((Vector3 *)a_01,s3 - s2);
      local_248.z = VVar9.z;
      local_238.z = local_248.z;
      local_248._0_8_ = VVar9._0_8_;
      local_238.x = local_248.x;
      local_238.y = local_248.y;
      local_248 = VVar9;
      VVar9 = operator+(&local_1d8,&local_238);
      local_258.z = VVar9.z;
      local_1c8.z = local_258.z;
      local_258._0_8_ = VVar9._0_8_;
      local_1c8.x = local_258.x;
      local_1c8.y = local_258.y;
      local_258 = VVar9;
      VVar9 = operator/(&local_1c8,local_8c + local_8c);
      _b = VVar9._0_8_;
      local_1bc._0_4_ = b;
      local_1bc._4_4_ = a;
      local_260 = VVar9.z;
      St.x = local_260;
      _b = VVar9;
      c = dot((Vector3 *)local_100,(Vector3 *)local_100);
      sigma1 = dot((Vector3 *)local_100,(Vector3 *)local_1bc);
      local_274 = dot((Vector3 *)local_1bc,(Vector3 *)local_1bc);
      sigma2 = 0.0;
      fVar6 = c + local_274;
      fVar7 = square(c - local_274);
      fVar8 = square(sigma1);
      local_280 = sqrtf(fVar8 * 4.0 + fVar7);
      local_280 = fVar6 - local_280;
      fVar6 = max<float>(&sigma2,&local_280);
      local_278 = sqrtf(fVar6 * 0.5);
      rmsStretch = 0.0;
      fVar6 = c + local_274;
      fVar7 = square(c - local_274);
      fVar8 = square(sigma1);
      fVar7 = sqrtf(fVar8 * 4.0 + fVar7);
      rmsStretch2 = fVar6 + fVar7;
      fVar6 = max<float>(&rmsStretch,&rmsStretch2);
      local_284 = sqrtf(fVar6 * 0.5);
      if (((local_284 <= local_278) && (bVar1 = equal(local_278,local_284,0.0001), !bVar1)) &&
         (s_print != (undefined *)0x0)) {
        (*(code *)s_print)("\rASSERT: %s %s %d\n",
                           "sigma2 > sigma1 || equal(sigma1, sigma2, kEpsilon)",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                           ,0x1bb8);
      }
      fVar6 = sqrtf((c + local_274) * 0.5);
      fVar7 = square(local_278);
      fVar8 = square(local_284);
      fVar7 = sqrtf((fVar7 + fVar8) * 0.5);
      bVar1 = equal(fVar6,fVar7,0.01);
      if (!bVar1) {
        __assert_fail("equal(rmsStretch, rmsStretch2, 0.01f)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                      ,0x1bbe,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)")
        ;
      }
      fVar6 = square(fVar6);
      this->stretchMetric = fVar6 * local_90 + this->stretchMetric;
      fVar6 = max<float>(&this->maxStretchMetric,&local_284);
      this->maxStretchMetric = fVar6;
      bVar1 = isZero(local_278,1e-06);
      if (!bVar1) {
        this->conformalMetric = (local_284 / local_278) * local_90 + this->conformalMetric;
      }
      this->authalicMetric = local_278 * local_284 * local_90 + this->authalicMetric;
      this->totalGeometricArea = local_90 + this->totalGeometricArea;
      this->totalParametricArea = local_8c + this->totalParametricArea;
    }
  }
  bVar2 = isFinite(this->totalParametricArea);
  bVar1 = false;
  if (bVar2) {
    bVar1 = 0.0 <= this->totalParametricArea;
  }
  if (!bVar1) {
    __assert_fail("isFinite(totalParametricArea) && totalParametricArea >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcb,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  bVar2 = isFinite(this->totalGeometricArea);
  bVar1 = false;
  if (bVar2) {
    bVar1 = 0.0 <= this->totalGeometricArea;
  }
  if (!bVar1) {
    __assert_fail("isFinite(totalGeometricArea) && totalGeometricArea >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcc,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  bVar1 = isFinite(this->stretchMetric);
  if (!bVar1) {
    __assert_fail("isFinite(stretchMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bcd,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  bVar1 = isFinite(this->maxStretchMetric);
  if (bVar1) {
    bVar1 = isFinite(this->conformalMetric);
    if (!bVar1) {
      __assert_fail("isFinite(conformalMetric)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                    ,0x1bcf,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
    }
    bVar1 = isFinite(this->authalicMetric);
    if (bVar1) {
      if (0.0 < this->totalGeometricArea) {
        fVar3 = sqrtf(this->totalParametricArea / this->totalGeometricArea);
        fVar6 = sqrtf(this->stretchMetric / this->totalGeometricArea);
        this->stretchMetric = fVar6 * fVar3;
        this->maxStretchMetric = fVar3 * this->maxStretchMetric;
        fVar3 = sqrtf(this->conformalMetric / this->totalGeometricArea);
        this->conformalMetric = fVar3;
        fVar3 = sqrtf(this->authalicMetric / this->totalGeometricArea);
        this->authalicMetric = fVar3;
      }
      return;
    }
    __assert_fail("isFinite(authalicMetric)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x1bd0,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
  }
  __assert_fail("isFinite(maxStretchMetric)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x1bce,"void xatlas::internal::param::Quality::computeMetrics(const Mesh *)");
}

Assistant:

void computeMetrics(const Mesh *mesh)
	{
		totalGeometricArea = totalParametricArea = 0.0f;
		stretchMetric = maxStretchMetric = conformalMetric = authalicMetric = 0.0f;
		const uint32_t faceCount = mesh->faceCount();
		for (uint32_t f = 0; f < faceCount; f++) {
			Vector3 pos[3];
			Vector2 texcoord[3];
			for (int i = 0; i < 3; i++) {
				const uint32_t v = mesh->vertexAt(f * 3 + i);
				pos[i] = mesh->position(v);
				texcoord[i] = mesh->texcoord(v);
			}
			// Evaluate texture stretch metric. See:
			// - "Texture Mapping Progressive Meshes", Sander, Snyder, Gortler & Hoppe
			// - "Mesh Parameterization: Theory and Practice", Siggraph'07 Course Notes, Hormann, Levy & Sheffer.
			const float t1 = texcoord[0].x;
			const float s1 = texcoord[0].y;
			const float t2 = texcoord[1].x;
			const float s2 = texcoord[1].y;
			const float t3 = texcoord[2].x;
			const float s3 = texcoord[2].y;
			float parametricArea = ((s2 - s1) * (t3 - t1) - (s3 - s1) * (t2 - t1)) * 0.5f;
			if (isZero(parametricArea, kAreaEpsilon))
				continue;
			if (parametricArea < 0.0f)
				parametricArea = fabsf(parametricArea);
			const float geometricArea = length(cross(pos[1] - pos[0], pos[2] - pos[0])) / 2;
			const Vector3 Ss = (pos[0] * (t2 - t3) + pos[1] * (t3 - t1) + pos[2] * (t1 - t2)) / (2 * parametricArea);
			const Vector3 St = (pos[0] * (s3 - s2) + pos[1] * (s1 - s3) + pos[2] * (s2 - s1)) / (2 * parametricArea);
			const float a = dot(Ss, Ss); // E
			const float b = dot(Ss, St); // F
			const float c = dot(St, St); // G
										 // Compute eigen-values of the first fundamental form:
			const float sigma1 = sqrtf(0.5f * max(0.0f, a + c - sqrtf(square(a - c) + 4 * square(b)))); // gamma uppercase, min eigenvalue.
			const float sigma2 = sqrtf(0.5f * max(0.0f, a + c + sqrtf(square(a - c) + 4 * square(b)))); // gamma lowercase, max eigenvalue.
			XA_ASSERT(sigma2 > sigma1 || equal(sigma1, sigma2, kEpsilon));
			// isometric: sigma1 = sigma2 = 1
			// conformal: sigma1 / sigma2 = 1
			// authalic: sigma1 * sigma2 = 1
			const float rmsStretch = sqrtf((a + c) * 0.5f);
			const float rmsStretch2 = sqrtf((square(sigma1) + square(sigma2)) * 0.5f);
			XA_DEBUG_ASSERT(equal(rmsStretch, rmsStretch2, 0.01f));
			XA_UNUSED(rmsStretch2);
			stretchMetric += square(rmsStretch) * geometricArea;
			maxStretchMetric = max(maxStretchMetric, sigma2);
			if (!isZero(sigma1, 0.000001f)) {
				// sigma1 is zero when geometricArea is zero.
				conformalMetric += (sigma2 / sigma1) * geometricArea;
			}
			authalicMetric += (sigma1 * sigma2) * geometricArea;
			// Accumulate total areas.
			totalGeometricArea += geometricArea;
			totalParametricArea += parametricArea;
		}
		XA_DEBUG_ASSERT(isFinite(totalParametricArea) && totalParametricArea >= 0);
		XA_DEBUG_ASSERT(isFinite(totalGeometricArea) && totalGeometricArea >= 0);
		XA_DEBUG_ASSERT(isFinite(stretchMetric));
		XA_DEBUG_ASSERT(isFinite(maxStretchMetric));
		XA_DEBUG_ASSERT(isFinite(conformalMetric));
		XA_DEBUG_ASSERT(isFinite(authalicMetric));
		if (totalGeometricArea > 0.0f) {
			const float normFactor = sqrtf(totalParametricArea / totalGeometricArea);
			stretchMetric = sqrtf(stretchMetric / totalGeometricArea) * normFactor;
			maxStretchMetric  *= normFactor;
			conformalMetric = sqrtf(conformalMetric / totalGeometricArea);
			authalicMetric = sqrtf(authalicMetric / totalGeometricArea);
		}
	}